

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void add_tokens(VARR_token_t *to,VARR_token_t *from)

{
  short sVar1;
  ushort uVar2;
  ushort uVar3;
  short *psVar4;
  ushort *puVar5;
  ushort *puVar6;
  VARR_char *pVVar7;
  VARR_stream_t *pVVar8;
  size_t sVar9;
  MIR_context_t pMVar10;
  char *name;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  token_t t;
  token_t ptVar14;
  token_t ptVar15;
  undefined4 *puVar16;
  void *pvVar17;
  char *pcVar18;
  uint uVar19;
  undefined8 in_RCX;
  uint uVar20;
  char *extraout_RDX;
  undefined8 *extraout_RDX_00;
  char **ppcVar21;
  c2m_ctx_t pcVar22;
  c2m_ctx_t pcVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  c2mir_options *pcVar28;
  bool bVar29;
  pos_t pos;
  
  if (from == (VARR_token_t *)0x0) {
LAB_001942cb:
    add_tokens_cold_2();
    return;
  }
  uVar27 = 0;
  ptVar14 = (token_t)from;
  pcVar23 = (c2m_ctx_t)to;
  while( true ) {
    if (from->els_num <= uVar27) {
      return;
    }
    if (from->varr == (token_t *)0x0) break;
    ptVar14 = from->varr[uVar27];
    pcVar23 = (c2m_ctx_t)to;
    add_token(to,ptVar14);
    uVar27 = uVar27 + 1;
    if (from == (VARR_token_t *)0x0) goto LAB_001942cb;
  }
  add_tokens_cold_1();
  t = ptVar14;
  pcVar22 = pcVar23;
  if (ptVar14 != (token_t)0x0) {
    if ((int)(uint)*(undefined8 *)ptVar14 < 1) {
      return;
    }
    uVar27 = (ulong)((uint)*(undefined8 *)ptVar14 & 0x7fffffff);
    while( true ) {
      uVar25 = uVar27 - 1;
      lVar26 = *(long *)&(ptVar14->pos).lno;
      if ((lVar26 == 0) || (*(ulong *)ptVar14 <= uVar25)) break;
      pos.lno = (int)in_RCX;
      pos.ln_pos = (int)((ulong)in_RCX >> 0x20);
      pos.fname = extraout_RDX;
      t = copy_token(pcVar23,*(token_t *)(lVar26 + uVar25 * 8),pos);
      pcVar22 = pcVar23;
      unget_next_pptoken(pcVar23,t);
      bVar29 = (long)uVar27 < 2;
      uVar27 = uVar25;
      if (bVar29) {
        return;
      }
    }
    copy_and_push_back_cold_1();
  }
  copy_and_push_back_cold_2();
  ptVar14 = t;
  pcVar23 = pcVar22;
  if (t != (token_t)0x0) {
    uVar19 = *(uint *)t;
    uVar20 = uVar19;
    while (uVar24 = uVar20, 0 < (int)uVar24) {
      lVar26 = *(long *)&(t->pos).lno;
      if (lVar26 == 0) goto LAB_00194724;
      uVar20 = uVar24 - 1;
      uVar27 = *(ulong *)t;
      if (uVar27 <= uVar20) goto LAB_00194724;
      psVar4 = *(short **)(lVar26 + (ulong)uVar20 * 8);
      if (*psVar4 == 0x142) {
        if ((uVar24 == 1) || ((int)uVar19 <= (int)uVar24)) goto LAB_00194738;
        if (uVar27 <= uVar24) {
          do_concat_cold_1();
LAB_00194780:
          do_concat_cold_9();
LAB_00194785:
          do_concat_cold_6();
LAB_0019478a:
          do_concat_cold_7();
LAB_0019478f:
          do_concat_cold_8();
LAB_00194794:
          do_concat_cold_13();
LAB_00194799:
          __assert_fail("cs->f == NULL && cs->f == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x42a,"void remove_string_stream(c2m_ctx_t)");
        }
        sVar1 = **(short **)(lVar26 + (ulong)uVar24 * 8);
        if ((sVar1 == 0x20) || (uVar20 = uVar24, sVar1 == 10)) {
          uVar20 = uVar24 + 1;
        }
        uVar25 = (ulong)(uVar24 - 2);
        if (uVar27 <= uVar25) goto LAB_00194733;
        sVar1 = **(short **)(lVar26 + uVar25 * 8);
        if ((sVar1 == 0x20) || (sVar1 == 10)) {
          uVar25 = (ulong)(uVar24 - 3);
        }
        iVar13 = (int)uVar25;
        if ((iVar13 < 0) || ((int)uVar19 <= (int)uVar20)) {
LAB_0019475c:
          __assert_fail("k >= 0 && j < len",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0xaae,"VARR_token_t *do_concat(c2m_ctx_t, VARR_token_t *)");
        }
        if (uVar27 <= uVar20) goto LAB_0019472e;
        if (uVar27 <= uVar25) {
          do_concat_cold_4();
          goto LAB_0019475c;
        }
        puVar5 = *(ushort **)(lVar26 + (ulong)uVar20 * 8);
        uVar2 = *puVar5;
        pcVar23 = (c2m_ctx_t)(ulong)uVar2;
        puVar6 = *(ushort **)(lVar26 + uVar25 * 8);
        uVar3 = *puVar6;
        ptVar14 = (token_t)(ulong)uVar3;
        if ((uVar2 != 0x141) && (uVar3 != 0x141)) {
          pVVar7 = pcVar22->temp_string;
          if ((pVVar7 == (VARR_char *)0x0) || (pVVar7->varr == (char *)0x0)) goto LAB_00194780;
          pVVar7->els_num = 0;
          add_to_temp_string(pcVar22,*(char **)(puVar6 + 0x14));
          add_to_temp_string(pcVar22,*(char **)(puVar5 + 0x14));
          reverse(pcVar22->temp_string);
          if (pcVar22->temp_string == (VARR_char *)0x0) goto LAB_0019478f;
          set_string_stream(pcVar22,pcVar22->temp_string->varr,*(pos_t *)(puVar6 + 4),
                            (_func_void_char_ptr_VARR_char_ptr *)0x0);
          ptVar14 = get_next_pptoken_1(pcVar22,0);
          do {
            ptVar15 = get_next_pptoken_1(pcVar22,0);
          } while (*(short *)ptVar15 == 0x147);
          if (*(short *)ptVar15 != 0x13d) {
            reverse(pcVar22->temp_string);
            error(pcVar22,0x1c36c9,*(char **)(puVar6 + 4),*(undefined8 *)(puVar6 + 8));
            if (pcVar22->cs->f != (FILE *)0x0) goto LAB_00194799;
            pVVar8 = pcVar22->streams;
            if (((pVVar8 == (VARR_stream_t *)0x0) || (pVVar8->varr == (stream_t *)0x0)) ||
               (sVar9 = pVVar8->els_num, sVar9 == 0)) goto LAB_0019478a;
            pVVar8->els_num = sVar9 - 1;
            free_stream(pVVar8->varr[sVar9 - 1]);
            pVVar8 = pcVar22->streams;
            if (((pVVar8 == (VARR_stream_t *)0x0) || (pVVar8->varr == (stream_t *)0x0)) ||
               (pVVar8->els_num == 0)) goto LAB_00194785;
            pcVar22->cs = pVVar8->varr[pVVar8->els_num - 1];
          }
          del_tokens((VARR_token_t *)t,iVar13 + 1,uVar20 - iVar13);
          lVar26 = *(long *)&(t->pos).lno;
          if ((lVar26 != 0) && (uVar25 < *(ulong *)t)) {
            *(token_t *)(lVar26 + uVar25 * 8) = ptVar14;
            goto LAB_001946ce;
          }
          goto LAB_00194729;
        }
        if (uVar2 == 0x141) {
          uVar24 = uVar20 + 1;
          if ((int)uVar19 <= (int)uVar24) goto LAB_00194603;
          if (uVar24 < uVar27) {
            sVar1 = **(short **)(lVar26 + (ulong)uVar24 * 8);
            if ((sVar1 == 0x20) || (sVar1 == 10)) {
              uVar20 = uVar24;
            }
            goto LAB_00194603;
          }
LAB_001947bd:
          do_concat_cold_10();
          goto LAB_001947c2;
        }
        uVar20 = uVar20 - 1;
LAB_00194603:
        if (uVar3 == 0x141) {
          if (iVar13 == 0) {
            uVar25 = 0;
          }
          else {
            uVar19 = iVar13 - 1;
            if (uVar27 <= uVar19) {
              do_concat_cold_11();
              goto LAB_001947bd;
            }
            sVar1 = **(short **)(lVar26 + (ulong)uVar19 * 8);
            if ((sVar1 == 0x20) || (sVar1 == 10)) {
              uVar25 = (ulong)uVar19;
            }
          }
        }
        else {
          uVar25 = (ulong)(iVar13 + 1);
        }
        iVar13 = (int)uVar25;
        if ((uVar2 == 0x141) && (uVar3 == 0x141)) {
          del_tokens((VARR_token_t *)t,iVar13,uVar20 - iVar13);
          uVar11 = *(undefined8 *)(psVar4 + 4);
          uVar12 = *(undefined8 *)(psVar4 + 8);
          puVar16 = (undefined4 *)reg_malloc(pcVar22,0x30);
          *puVar16 = 0x20;
          *(undefined8 *)(puVar16 + 2) = uVar11;
          *(undefined8 *)(puVar16 + 4) = uVar12;
          *(char **)(puVar16 + 10) = "";
          puVar16[6] = 0;
          *(undefined8 *)(puVar16 + 8) = 0;
          lVar26 = *(long *)&(t->pos).lno;
          if ((lVar26 == 0) || (*(ulong *)t <= uVar25)) goto LAB_00194794;
          *(undefined4 **)(lVar26 + uVar25 * 8) = puVar16;
        }
        else {
          del_tokens((VARR_token_t *)t,iVar13,(uVar20 - iVar13) + 1);
        }
LAB_001946ce:
        uVar19 = *(uint *)t;
        uVar20 = (uint)uVar25;
      }
    }
    if ((int)uVar19 < 1) {
      return;
    }
    uVar27 = (ulong)uVar19;
    while( true ) {
      uVar25 = uVar27 - 1;
      lVar26 = *(long *)&(t->pos).lno;
      if ((lVar26 == 0) || (*(ulong *)t <= uVar25)) break;
      *(undefined2 *)(*(long *)(lVar26 + uVar25 * 8) + 2) = 1;
      bVar29 = (long)uVar27 < 2;
      uVar27 = uVar25;
      if (bVar29) {
        return;
      }
    }
    do_concat_cold_12();
LAB_00194724:
    do_concat_cold_14();
LAB_00194729:
    do_concat_cold_5();
LAB_0019472e:
    do_concat_cold_3();
LAB_00194733:
    do_concat_cold_2();
LAB_00194738:
    __assert_fail("k >= 0 && j < len",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0xaa9,"VARR_token_t *do_concat(c2m_ctx_t, VARR_token_t *)");
  }
LAB_001947c2:
  do_concat_cold_15();
  pcVar22 = (c2m_ctx_t)pcVar23->env[0].__jmpbuf[0];
  if (pcVar22 != (c2m_ctx_t)0x0) {
    pcVar28 = (c2mir_options *)((long)&pcVar23->ctx->gen_ctx + 1);
    if (pcVar23->options < pcVar28) {
      pcVar28 = (c2mir_options *)((long)&pcVar28->message_file + ((ulong)pcVar28 >> 1));
      pvVar17 = realloc(pcVar22,(long)pcVar28 * 8);
      pcVar23->env[0].__jmpbuf[0] = (long)pvVar17;
      pcVar23->options = pcVar28;
    }
    pMVar10 = pcVar23->ctx;
    pcVar23->ctx = (MIR_context_t)((long)&pMVar10->gen_ctx + 1);
    *(token_t *)(pcVar23->env[0].__jmpbuf[0] + (long)pMVar10 * 8) = ptVar14;
    return;
  }
  VARR_macro_call_tpush_cold_1();
  *extraout_RDX_00 = 0;
  if ((*(short *)ptVar14 != 0x102) && (*(short *)ptVar14 != 0x13e)) {
    __assert_fail("t->code == T_STR || t->code == T_HEADER",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x99b,"const char *get_include_fname(c2m_ctx_t, token_t, const char **)");
  }
  name = (ptVar14->node->u).s.s;
  if (*name == '/') {
    return;
  }
  if (*ptVar14->repr == '\"') {
    pcVar18 = pcVar22->cs->fname;
    if (pcVar18 != (char *)0x0) {
      pcVar18 = get_full_name(pcVar22,pcVar18,name,0);
      iVar13 = file_found_p(pcVar18);
      if (iVar13 != 0) {
        uniq_cstr(pcVar22,pcVar18);
        return;
      }
    }
    bVar29 = *pcVar22->header_dirs == (char *)0x0;
    if (!bVar29) {
      pcVar18 = get_full_name(pcVar22,*pcVar22->header_dirs,name,1);
      iVar13 = file_found_p(pcVar18);
      if (iVar13 == 0) {
        lVar26 = 8;
        do {
          pcVar18 = *(char **)((long)pcVar22->header_dirs + lVar26);
          bVar29 = pcVar18 == (char *)0x0;
          if (bVar29) goto LAB_0019492f;
          pcVar18 = get_full_name(pcVar22,pcVar18,name,1);
          iVar13 = file_found_p(pcVar18);
          lVar26 = lVar26 + 8;
        } while (iVar13 == 0);
      }
      uniq_cstr(pcVar22,pcVar18);
    }
LAB_0019492f:
    if (!bVar29) {
      return;
    }
  }
  ppcVar21 = &standard_includes[0].content;
  bVar29 = false;
  uVar27 = 0;
  while ((((string_include_t *)(ppcVar21 + -1))->name == (char *)0x0 ||
         (iVar13 = strcmp(name,((string_include_t *)(ppcVar21 + -1))->name), iVar13 != 0))) {
    bVar29 = 9 < uVar27;
    uVar27 = uVar27 + 1;
    ppcVar21 = ppcVar21 + 2;
    if (uVar27 == 0xb) {
LAB_00194987:
      if ((bVar29) && (*pcVar22->system_header_dirs != (char *)0x0)) {
        pcVar18 = get_full_name(pcVar22,*pcVar22->system_header_dirs,name,1);
        iVar13 = file_found_p(pcVar18);
        if (iVar13 == 0) {
          lVar26 = 8;
          do {
            pcVar18 = *(char **)((long)pcVar22->system_header_dirs + lVar26);
            if (pcVar18 == (char *)0x0) {
              return;
            }
            pcVar18 = get_full_name(pcVar22,pcVar18,name,1);
            iVar13 = file_found_p(pcVar18);
            lVar26 = lVar26 + 8;
          } while (iVar13 == 0);
        }
        uniq_cstr(pcVar22,pcVar18);
      }
      return;
    }
  }
  *extraout_RDX_00 = *ppcVar21;
  goto LAB_00194987;
}

Assistant:

static void add_tokens (VARR (token_t) * to, VARR (token_t) * from) {
  for (size_t i = 0; i < VARR_LENGTH (token_t, from); i++)
    add_token (to, VARR_GET (token_t, from, i));
}